

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFRAgent.cpp
# Opt level: O1

void __thiscall
Agent::CFRAgent<Kuhn::Game>::CFRAgent(CFRAgent<Kuhn::Game> *this,mt19937 *engine,string *path)

{
  void *x;
  binary_iarchive ia;
  ifstream ifs;
  binary_iarchive bStack_278;
  istream local_218 [520];
  
  this->mEngine = engine;
  (this->mStrategy)._M_h._M_buckets = &(this->mStrategy)._M_h._M_single_bucket;
  (this->mStrategy)._M_h._M_bucket_count = 1;
  (this->mStrategy)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mStrategy)._M_h._M_element_count = 0;
  (this->mStrategy)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mStrategy)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mStrategy)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::ifstream::ifstream(local_218,(string *)path,_S_in);
  boost::archive::binary_iarchive::binary_iarchive(&bStack_278,local_218,0);
  boost::serialization::
  singleton<boost::archive::detail::iserializer<boost::archive::binary_iarchive,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>_>_>
  ::get_instance();
  boost::archive::detail::basic_iarchive::load_object
            (&bStack_278,(basic_iserializer *)&this->mStrategy);
  std::ifstream::close();
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&bStack_278);
  boost::archive::
  basic_binary_iprimitive<boost::archive::binary_iarchive,char,std::char_traits<char>>::
  ~basic_binary_iprimitive
            ((basic_binary_iprimitive<boost::archive::binary_iarchive,char,std::char_traits<char>> *
             )&bStack_278.
               super_binary_iarchive_impl<boost::archive::binary_iarchive,_char,_std::char_traits<char>_>
               .
               super_basic_binary_iprimitive<boost::archive::binary_iarchive,_char,_std::char_traits<char>_>
            );
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

CFRAgent<T>::CFRAgent(std::mt19937 &engine, const std::string &path) : mEngine(engine) {
    std::ifstream ifs(path);
    boost::archive::binary_iarchive ia(ifs);
    ia >> mStrategy;
    ifs.close();
}